

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addCommandBufferInfo
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,cl_command_queue queue)

{
  cl_platform_id p_Var1;
  mapped_type *pp_Var2;
  long in_RSI;
  cl_command_queue in_RDI;
  map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
  *unaff_retaddr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  CLIntercept *in_stack_ffffffffffffffd0;
  cl_command_queue __k;
  
  if (in_RSI != 0) {
    __k = in_RDI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    p_Var1 = getPlatform(in_stack_ffffffffffffffd0,in_RDI);
    pp_Var2 = std::
              map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](unaff_retaddr,(key_type *)__k);
    *pp_Var2 = p_Var1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a260);
  }
  return;
}

Assistant:

void CLIntercept::addCommandBufferInfo(
    cl_command_buffer_khr cmdbuf,
    cl_command_queue queue )
{
    if( cmdbuf )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_CommandBufferInfoMap[cmdbuf] = getPlatform(queue);
    }
}